

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

MutableStringView __thiscall Corrade::Containers::String::find(String *this,StringView substring)

{
  StringView substring_00;
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_40;
  String *local_30;
  String *this_local;
  StringView substring_local;
  
  substring_local._data = (char *)substring._sizePlusFlags;
  this_local = (String *)substring._data;
  local_30 = this;
  BasicStringView<char>::BasicStringView(&local_40,this);
  substring_00._sizePlusFlags = (size_t)substring_local._data;
  substring_00._data = (char *)this_local;
  BVar1 = BasicStringView<char>::findOr(&local_40,substring_00,(char *)0x0);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::find(const StringView substring) {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return MutableStringView{*this}.findOr(substring, nullptr);
}